

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Matchers::Floating::WithinUlpsMatcher::match(WithinUlpsMatcher *this)

{
  double *in_RSI;
  
  match((WithinUlpsMatcher *)
        ((long)&this[-1].super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString.field_2
        + 8),in_RSI);
  return;
}

Assistant:

bool WithinUlpsMatcher::match(double const& matchee) const {
        switch (m_type) {
        case FloatingPointKind::Float:
            return almostEqualUlps<float>(static_cast<float>(matchee), static_cast<float>(m_target), m_ulps);
        case FloatingPointKind::Double:
            return almostEqualUlps<double>(matchee, m_target, m_ulps);
        default:
            CATCH_INTERNAL_ERROR( "Unknown FloatingPointKind value" );
        }
    }